

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O2

Pubkey * __thiscall cfd::core::Pubkey::Compress(Pubkey *__return_storage_ptr__,Pubkey *this)

{
  bool bVar1;
  ByteData compress_data;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_48;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  
  bVar1 = IsCompress(this);
  if (bVar1) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__return_storage_ptr__,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
  }
  else {
    WallyUtil::CompressPubkey((ByteData *)&local_30,&this->data_);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&_Stack_48,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_30);
    Pubkey(__return_storage_ptr__,(ByteData *)&_Stack_48);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_48);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

Pubkey Pubkey::Compress() const {
  if (IsCompress()) {
    return *this;
  }

  ByteData compress_data = WallyUtil::CompressPubkey(data_);
  return Pubkey(compress_data);
}